

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

void __thiscall
duckdb::RegexpMatchesBindData::RegexpMatchesBindData
          (RegexpMatchesBindData *this,Options options,string *constant_string_p,
          bool constant_pattern)

{
  size_type sVar1;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> _Var2;
  bool bVar3;
  RE2 *this_00;
  pointer pRVar4;
  InvalidInputException *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> local_80;
  string *local_78;
  string *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined8 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  StringPiece local_40;
  
  local_60 = &local_50;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(constant_string_p->_M_dataplus)._M_p;
  paVar6 = &constant_string_p->field_2;
  if (paVar5 == paVar6) {
    local_50._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_50._8_8_ = *(undefined8 *)((long)&constant_string_p->field_2 + 8);
    paVar5 = local_60;
  }
  else {
    local_50._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  sVar1 = constant_string_p->_M_string_length;
  (constant_string_p->_M_dataplus)._M_p = (pointer)paVar6;
  constant_string_p->_M_string_length = 0;
  (constant_string_p->field_2)._M_local_buf[0] = '\0';
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__RegexpBaseBindData_024520d0;
  (this->super_RegexpBaseBindData).options.max_mem_ = options.max_mem_;
  (this->super_RegexpBaseBindData).options.encoding_ = options.encoding_;
  (this->super_RegexpBaseBindData).options.posix_syntax_ = options.posix_syntax_;
  (this->super_RegexpBaseBindData).options.longest_match_ = options.longest_match_;
  (this->super_RegexpBaseBindData).options.log_errors_ = options.log_errors_;
  (this->super_RegexpBaseBindData).options.literal_ = options.literal_;
  (this->super_RegexpBaseBindData).options.never_nl_ = options.never_nl_;
  (this->super_RegexpBaseBindData).options.dot_nl_ = options.dot_nl_;
  (this->super_RegexpBaseBindData).options.never_capture_ = options.never_capture_;
  (this->super_RegexpBaseBindData).options.case_sensitive_ = options.case_sensitive_;
  (this->super_RegexpBaseBindData).options.perl_classes_ = options.perl_classes_;
  (this->super_RegexpBaseBindData).options.word_boundary_ = options.word_boundary_;
  (this->super_RegexpBaseBindData).options.one_line_ = options.one_line_;
  (this->super_RegexpBaseBindData).options.field_0x17 = options._23_1_;
  paVar6 = &(this->super_RegexpBaseBindData).constant_string.field_2;
  (this->super_RegexpBaseBindData).constant_string._M_dataplus._M_p = (pointer)paVar6;
  if (paVar5 == local_60) {
    paVar6->_M_allocated_capacity = local_50._M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_RegexpBaseBindData).constant_string.field_2 + 8) =
         local_50._8_8_;
  }
  else {
    (this->super_RegexpBaseBindData).constant_string._M_dataplus._M_p = (pointer)paVar5;
    (this->super_RegexpBaseBindData).constant_string.field_2._M_allocated_capacity =
         local_50._M_allocated_capacity;
    paVar6 = paVar5;
  }
  (this->super_RegexpBaseBindData).constant_string._M_string_length = sVar1;
  local_58 = 0;
  local_50._M_allocated_capacity = local_50._M_allocated_capacity & 0xffffffffffffff00;
  (this->super_RegexpBaseBindData).constant_pattern = constant_pattern;
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__RegexpMatchesBindData_02452100;
  local_68 = &(this->range_min).field_2;
  (this->range_min)._M_dataplus._M_p = (pointer)local_68;
  (this->range_min)._M_string_length = 0;
  (this->range_min).field_2._M_local_buf[0] = '\0';
  (this->range_max)._M_dataplus._M_p = (pointer)&(this->range_max).field_2;
  (this->range_max)._M_string_length = 0;
  (this->range_max).field_2._M_local_buf[0] = '\0';
  if (constant_pattern) {
    local_70 = &this->range_min;
    local_78 = &this->range_max;
    this_00 = (RE2 *)operator_new(0x98);
    local_40.data_ = (const_pointer)paVar6;
    local_40.size_ = sVar1;
    duckdb_re2::RE2::RE2(this_00,&local_40,&options);
    local_80._M_head_impl = this_00;
    pRVar4 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                       ((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> *)
                        &local_80);
    if ((*(uint *)&pRVar4->field_0x44 & 0x1fffffff) != 0) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pRVar4 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                         ((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> *
                          )&local_80);
      InvalidInputException::InvalidInputException(this_01,pRVar4->error_);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pRVar4 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                       ((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> *)
                        &local_80);
    bVar3 = duckdb_re2::RE2::PossibleMatchRange(pRVar4,local_70,local_78,1000);
    _Var2._M_head_impl = local_80._M_head_impl;
    this->range_success = bVar3;
    if (local_80._M_head_impl != (RE2 *)0x0) {
      duckdb_re2::RE2::~RE2(local_80._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
  }
  else {
    this->range_success = false;
  }
  return;
}

Assistant:

RegexpMatchesBindData::RegexpMatchesBindData(duckdb_re2::RE2::Options options, string constant_string_p,
                                             bool constant_pattern)
    : RegexpBaseBindData(options, std::move(constant_string_p), constant_pattern) {
	if (constant_pattern) {
		auto pattern = make_uniq<RE2>(constant_string, options);
		if (!pattern->ok()) {
			throw InvalidInputException(pattern->error());
		}

		range_success = pattern->PossibleMatchRange(&range_min, &range_max, 1000);
	} else {
		range_success = false;
	}
}